

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O0

void stm_release(stm_object *obj)

{
  int iVar1;
  stm_object *obj_local;
  
  if (obj->copy != (stm_copy *)0x0) {
    rwlock_wlock(&obj->lock);
    stm_releasecopy(obj->copy);
    obj->copy = (stm_copy *)0x0;
    iVar1 = obj->reference + -1;
    obj->reference = iVar1;
    if (iVar1 < 1) {
      free(obj);
    }
    else {
      rwlock_wunlock(&obj->lock);
    }
    return;
  }
  __assert_fail("obj->copy",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-stm.c"
                ,0x39,"void stm_release(struct stm_object *)");
}

Assistant:

static void
stm_release(struct stm_object *obj) {
	assert(obj->copy);
	rwlock_wlock(&obj->lock);
	// writer release the stm object, so release the last copy .
	stm_releasecopy(obj->copy);
	obj->copy = NULL;
	if (--obj->reference > 0) {
		// stm object grab by readers, reset the copy to NULL.
		rwlock_wunlock(&obj->lock);
		return;
	}
	// no one grab the stm object, no need to unlock wlock.
	skynet_free(obj);
}